

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullpush.c
# Opt level: O2

void pull_bytes(void *dst,size_t len,uchar **cursor,size_t *max)

{
  size_t sVar1;
  uchar *puVar2;
  
  if (*max < len) {
    memcpy(dst,*cursor,*max);
    puVar2 = (uchar *)0x0;
    memset((void *)((long)dst + *max),0,len - *max);
    sVar1 = 0;
  }
  else {
    memcpy(dst,*cursor,len);
    puVar2 = *cursor + len;
    sVar1 = *max - len;
  }
  *cursor = puVar2;
  *max = sVar1;
  return;
}

Assistant:

void pull_bytes(void *dst, size_t len,
                const unsigned char **cursor, size_t *max)
{
    if (len > *max) {
        memcpy(dst, *cursor, *max);
        memset((char *)dst + *max, 0, len - *max);
        pull_failed(cursor, max);
        return;
    }
    memcpy(dst, *cursor, len);
    *cursor += len;
    *max -= len;
}